

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume.cpp
# Opt level: O0

bool __thiscall VolumeFile::unpackAll(VolumeFile *this,string *outDirectory)

{
  value_type vVar1;
  VolumeFile *this_00;
  VolumeFile *in_RSI;
  long in_RDI;
  bool bVar2;
  EntryUnpacker unpacker;
  EntryBTree rootEntryBtree;
  undefined4 in_stack_ffffffffffffff58;
  uint32_t in_stack_ffffffffffffff5c;
  EntryUnpacker *this_01;
  string local_70 [8];
  EntryUnpacker *in_stack_ffffffffffffff98;
  _Alloc_hider in_stack_ffffffffffffffa0;
  
  bVar2 = *(int *)(in_RDI + 0x2cc) != 0;
  if (bVar2) {
    this_00 = (VolumeFile *)
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x13379b);
    vVar1 = entryTreeOffset(this_00,in_stack_ffffffffffffff5c);
    advancePointer<unsigned_char>((uchar *)this_00,(ulong)vVar1);
    EntryBTree::EntryBTree
              ((EntryBTree *)this_00,
               (uint8_t *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    this_01 = (EntryUnpacker *)local_70;
    std::__cxx11::string::string((string *)this_01);
    EntryUnpacker::EntryUnpacker
              (this_01,in_RSI,(string *)this_00,
               (string *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    std::__cxx11::string::~string(local_70);
    BTree<EntryBTree,EntryKey>::traverse<EntryUnpacker_const>
              ((BTree<EntryBTree,_EntryKey> *)in_stack_ffffffffffffffa0._M_p,
               in_stack_ffffffffffffff98);
    EntryUnpacker::~EntryUnpacker((EntryUnpacker *)0x133831);
  }
  return bVar2;
}

Assistant:

bool VolumeFile::unpackAll(const std::string& outDirectory)
{
	if (m_entryTreeCount == 0) {
		return false;
	}
	
	const EntryBTree rootEntryBtree(
		advancePointer(m_data.data(), entryTreeOffset(0))
	);
	const EntryUnpacker unpacker(*this, outDirectory);
	rootEntryBtree.traverse(unpacker);

	return true;
}